

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O0

int mbedtls_hmac_drbg_seed_buf
              (mbedtls_hmac_drbg_context *ctx,mbedtls_md_info_t *md_info,uchar *data,size_t data_len
              )

{
  byte bVar1;
  int ret;
  size_t data_len_local;
  uchar *data_local;
  mbedtls_md_info_t *md_info_local;
  mbedtls_hmac_drbg_context *ctx_local;
  
  ctx_local._4_4_ = mbedtls_md_setup(&ctx->md_ctx,md_info,1);
  if (ctx_local._4_4_ == 0) {
    bVar1 = mbedtls_md_get_size(md_info);
    mbedtls_md_hmac_starts(&ctx->md_ctx,ctx->V,(ulong)bVar1);
    bVar1 = mbedtls_md_get_size(md_info);
    memset(ctx->V,1,(ulong)bVar1);
    mbedtls_hmac_drbg_update(ctx,data,data_len);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_hmac_drbg_seed_buf( mbedtls_hmac_drbg_context *ctx,
                        const mbedtls_md_info_t * md_info,
                        const unsigned char *data, size_t data_len )
{
    int ret;

    if( ( ret = mbedtls_md_setup( &ctx->md_ctx, md_info, 1 ) ) != 0 )
        return( ret );

    /*
     * Set initial working state.
     * Use the V memory location, which is currently all 0, to initialize the
     * MD context with an all-zero key. Then set V to its initial value.
     */
    mbedtls_md_hmac_starts( &ctx->md_ctx, ctx->V, mbedtls_md_get_size( md_info ) );
    memset( ctx->V, 0x01, mbedtls_md_get_size( md_info ) );

    mbedtls_hmac_drbg_update( ctx, data, data_len );

    return( 0 );
}